

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::FunctionBody::RestoreState(FunctionBody *this,ParseNodeFnc *pnodeFnc)

{
  FncFlags FVar1;
  code *pcVar2;
  bool bVar3;
  FncFlags FVar4;
  undefined4 *puVar5;
  char16 *pcVar6;
  FncFlags FVar7;
  wchar local_88 [4];
  char16 debugStringBuffer [42];
  
  if (((this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47 & 0x10) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xc3b,"(this->IsReparsed())","this->IsReparsed()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  if (((*(byte *)((long)&pnodeFnc->fncFlags + 1) & 0x40) >> 6 != (byte)this->field_0x17a >> 7) &&
     (DAT_015d346a == '\x01')) {
    pcVar6 = ParseableFunctionInfo::GetExternalDisplayName<Js::ParseableFunctionInfo>
                       (&this->super_ParseableFunctionInfo);
    FunctionProxy::GetDebugNumberSet((FunctionProxy *)this,(wchar (*) [42])local_88);
    Output::Trace(DebuggerPhase,L"Child calls eval is different on debug reparse: %s(%s)\n",pcVar6,
                  (wchar (*) [42])local_88);
  }
  if (((byte)((char)pnodeFnc->fncFlags & kFunctionCallsEval) >> 2 != (this->field_0x17b & 1)) &&
     (DAT_015d346a == '\x01')) {
    pcVar6 = ParseableFunctionInfo::GetExternalDisplayName<Js::ParseableFunctionInfo>
                       (&this->super_ParseableFunctionInfo);
    FunctionProxy::GetDebugNumberSet((FunctionProxy *)this,(wchar (*) [42])local_88);
    Output::Trace(DebuggerPhase,L"Calls eval is different on debug reparse: %s(%s)\n",pcVar6,
                  (wchar (*) [42])local_88);
  }
  if (((byte)((char)pnodeFnc->fncFlags & kFunctionHasReferenceableBuiltInArguments) >> 5 !=
       (this->field_0x17b & 2) >> 1) && (DAT_015d346a == '\x01')) {
    pcVar6 = ParseableFunctionInfo::GetExternalDisplayName<Js::ParseableFunctionInfo>
                       (&this->super_ParseableFunctionInfo);
    FunctionProxy::GetDebugNumberSet((FunctionProxy *)this,(wchar (*) [42])local_88);
    Output::Trace(DebuggerPhase,
                  L"Referenceable Built in args is different on debug reparse: %s(%s)\n",pcVar6,
                  (wchar (*) [42])local_88);
  }
  FVar1 = pnodeFnc->fncFlags;
  FVar4 = *(uint *)&this->field_0x178 >> 9 & kFunctionChildCallsEval;
  pnodeFnc->fncFlags =
       FVar4 | FVar1 & (kFunctionHasAnyWriteToFormals|kFunctionIsDefaultModuleExport|
                        kFunctionHasDirectSuper|kFunctionIsAsync|kFunctionIsDeclaredInParamScope|
                        kFunctionAsmjsMode|kFunctionIsGenerator|kFunctionIsStaticMember|
                        kFunctionHasDefaultArguments|kFunctionIsGeneratedDefault|kFunctionHasHomeObj
                        |kFunctionIsClassMember|kFunctionIsBaseClassConstructor|
                        kFunctionIsClassConstructor|kFunctionIsMethod|kFunctionHasSuperReference|
                        kFunctionHasNonSimpleParameterList|kFunctionIsLambda|kFunctionHasWithStmt|
                        kFunctionHasComputedName|kFunctionIsModule|kFunctionHasDestructuredParams|
                        kFunctionStrictMode|kFunctionHasNonThisStmt|kFunctionIsAccessor|
                        kFunctionHasReferenceableBuiltInArguments|kFunctionHasHeapArguments|
                        kFunctionUsesArguments|kFunctionCallsEval|kFunctionDeclaration|
                       kFunctionNested);
  FVar7 = *(uint *)&this->field_0x178 >> 0x16 & kFunctionCallsEval;
  pnodeFnc->fncFlags =
       FVar7 | FVar4 | FVar1 & (kFunctionHasAnyWriteToFormals|kFunctionIsDefaultModuleExport|
                                kFunctionHasDirectSuper|kFunctionIsAsync|
                                kFunctionIsDeclaredInParamScope|kFunctionAsmjsMode|
                                kFunctionIsGenerator|kFunctionIsStaticMember|
                                kFunctionHasDefaultArguments|kFunctionIsGeneratedDefault|
                                kFunctionHasHomeObj|kFunctionIsClassMember|
                                kFunctionIsBaseClassConstructor|kFunctionIsClassConstructor|
                                kFunctionIsMethod|kFunctionHasSuperReference|
                                kFunctionHasNonSimpleParameterList|kFunctionIsLambda|
                                kFunctionHasWithStmt|kFunctionHasComputedName|kFunctionIsModule|
                                kFunctionHasDestructuredParams|kFunctionStrictMode|
                                kFunctionHasNonThisStmt|kFunctionIsAccessor|
                                kFunctionHasReferenceableBuiltInArguments|kFunctionHasHeapArguments|
                                kFunctionUsesArguments|kFunctionDeclaration|kFunctionNested);
  pnodeFnc->fncFlags =
       *(uint *)&this->field_0x178 >> 0x14 & kFunctionHasReferenceableBuiltInArguments |
       FVar7 | FVar4 | FVar1 & (kFunctionHasAnyWriteToFormals|kFunctionIsDefaultModuleExport|
                                kFunctionHasDirectSuper|kFunctionIsAsync|
                                kFunctionIsDeclaredInParamScope|kFunctionAsmjsMode|
                                kFunctionIsGenerator|kFunctionIsStaticMember|
                                kFunctionHasDefaultArguments|kFunctionIsGeneratedDefault|
                                kFunctionHasHomeObj|kFunctionIsClassMember|
                                kFunctionIsBaseClassConstructor|kFunctionIsClassConstructor|
                                kFunctionIsMethod|kFunctionHasSuperReference|
                                kFunctionHasNonSimpleParameterList|kFunctionIsLambda|
                                kFunctionHasWithStmt|kFunctionHasComputedName|kFunctionIsModule|
                                kFunctionHasDestructuredParams|kFunctionStrictMode|
                                kFunctionHasNonThisStmt|kFunctionIsAccessor|
                                kFunctionHasHeapArguments|kFunctionUsesArguments|
                                kFunctionDeclaration|kFunctionNested);
  return;
}

Assistant:

void FunctionBody::RestoreState(ParseNodeFnc * pnodeFnc)
    {
        Assert(this->IsReparsed());
#if ENABLE_DEBUG_CONFIG_OPTIONS
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
        if(!!pnodeFnc->ChildCallsEval() != this->GetChildCallsEval())
        {
            OUTPUT_VERBOSE_TRACE(Js::DebuggerPhase, _u("Child calls eval is different on debug reparse: %s(%s)\n"), this->GetExternalDisplayName(), this->GetDebugNumberSet(debugStringBuffer));
        }
        if(!!pnodeFnc->CallsEval() != this->GetCallsEval())
        {
            OUTPUT_VERBOSE_TRACE(Js::DebuggerPhase, _u("Calls eval is different on debug reparse: %s(%s)\n"), this->GetExternalDisplayName(), this->GetDebugNumberSet(debugStringBuffer));
        }
        if(!!pnodeFnc->HasReferenceableBuiltInArguments() != this->HasReferenceableBuiltInArguments())
        {
            OUTPUT_VERBOSE_TRACE(Js::DebuggerPhase, _u("Referenceable Built in args is different on debug reparse: %s(%s)\n"), this->GetExternalDisplayName(), this->GetDebugNumberSet(debugStringBuffer));
        }

        pnodeFnc->SetChildCallsEval(this->GetChildCallsEval());
        pnodeFnc->SetCallsEval(this->GetCallsEval());
        pnodeFnc->SetHasReferenceableBuiltInArguments(this->HasReferenceableBuiltInArguments());
    }